

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O0

void __thiscall
ft::list<int,ft::allocator<int>>::remove_if<bool(*)(int_const&)>
          (list<int,ft::allocator<int>> *this,_func_bool_int_ptr *pred)

{
  Node *pNVar1;
  bool bVar2;
  byte bVar3;
  reference pvVar4;
  listIterator<int> local_68;
  list<int,_ft::allocator<int>_> local_58;
  undefined1 local_38 [16];
  undefined1 local_28 [8];
  iterator it;
  _func_bool_int_ptr *pred_local;
  list<int,_ft::allocator<int>_> *this_local;
  
  it.m_node = (Node *)pred;
  list<int,_ft::allocator<int>_>::begin((list<int,_ft::allocator<int>_> *)local_28);
  while( true ) {
    list<int,_ft::allocator<int>_>::end((list<int,_ft::allocator<int>_> *)local_38);
    bVar2 = operator!=((listIterator<int> *)local_28,(listIterator<int> *)local_38);
    listIterator<int>::~listIterator((listIterator<int> *)local_38);
    pNVar1 = it.m_node;
    if (!bVar2) break;
    pvVar4 = listIterator<int>::operator*((listIterator<int> *)local_28);
    bVar3 = (*(code *)pNVar1)(pvVar4);
    if ((bVar3 & 1) == 0) {
      listIterator<int>::operator++((listIterator<int> *)local_28);
    }
    else {
      listIterator<int>::listIterator(&local_68,(listIterator<int> *)local_28);
      list<int,_ft::allocator<int>_>::erase(&local_58,(iterator *)this);
      listIterator<int>::operator=((listIterator<int> *)local_28,(listIterator<int> *)&local_58);
      listIterator<int>::~listIterator((listIterator<int> *)&local_58);
      listIterator<int>::~listIterator(&local_68);
    }
  }
  listIterator<int>::~listIterator((listIterator<int> *)local_28);
  return;
}

Assistant:

void remove_if(Predicate pred) {
		iterator	it = this->begin();
		while (it != this->end()) {
			if (pred(*it))
				it = this->erase(it);
			else
				++it;
		}
	}